

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O0

void __thiscall TCMallocTest_Ranges_Test::TestBody(TCMallocTest_Ranges_Test *this)

{
  byte bVar1;
  Type type;
  void *ptr;
  void *ptr_00;
  TestingPortal *pTVar2;
  _func_void_void_ptr *p_Var3;
  long *plVar4;
  Type releasedType;
  void *b;
  void *a;
  TCMallocTest_Ranges_Test *this_local;
  
  ptr = malloc(0x100000);
  ptr_00 = malloc(0x100000);
  pTVar2 = tcmalloc::TestingPortal::Get();
  bVar1 = (*(code *)**(undefined8 **)pTVar2)();
  type = FREE;
  if ((bVar1 & 1) != 0) {
    type = UNMAPPED;
  }
  CheckRangeCallback(ptr,INUSE,0x100000);
  CheckRangeCallback(ptr_00,INUSE,0x100000);
  p_Var3 = __noopt<void(*)(void*)noexcept>_void____void__noexcept__(free);
  (*p_Var3)(ptr);
  CheckRangeCallback(ptr,FREE,0x100000);
  CheckRangeCallback(ptr_00,INUSE,0x100000);
  plVar4 = (long *)MallocExtension::instance();
  (**(code **)(*plVar4 + 0x90))();
  CheckRangeCallback(ptr,type,0x100000);
  CheckRangeCallback(ptr_00,INUSE,0x100000);
  p_Var3 = __noopt<void(*)(void*)noexcept>_void____void__noexcept__(free);
  (*p_Var3)(ptr_00);
  CheckRangeCallback(ptr,type,0x100000);
  CheckRangeCallback(ptr_00,FREE,0x100000);
  return;
}

Assistant:

TEST(TCMallocTest, Ranges) {
  static const int MB = 1048576;
  void* a = malloc(MB);
  void* b = malloc(MB);
  base::MallocRange::Type releasedType =
    TestingPortal::Get()->HaveSystemRelease() ? base::MallocRange::UNMAPPED : base::MallocRange::FREE;

  CheckRangeCallback(a, base::MallocRange::INUSE, MB);
  CheckRangeCallback(b, base::MallocRange::INUSE, MB);

  (noopt(free))(a);

  CheckRangeCallback(a, base::MallocRange::FREE, MB);
  CheckRangeCallback(b, base::MallocRange::INUSE, MB);

  MallocExtension::instance()->ReleaseFreeMemory();

  CheckRangeCallback(a, releasedType, MB);
  CheckRangeCallback(b, base::MallocRange::INUSE, MB);

  (noopt(free))(b);

  CheckRangeCallback(a, releasedType, MB);
  CheckRangeCallback(b, base::MallocRange::FREE, MB);
}